

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

void __thiscall ezc3d::DataNS::Points3dNS::Point::set(Point *this,double x,double y,double z)

{
  ulong uVar1;
  reference pvVar2;
  long *in_RDI;
  double unaff_retaddr;
  
  Vector3d::set((Vector3d *)y,z,unaff_retaddr,(double)in_RDI);
  uVar1 = (**(code **)(*in_RDI + 0x100))();
  if ((uVar1 & 1) == 0) {
LAB_00177af0:
    (**(code **)(*in_RDI + 0x148))(0xbff0000000000000);
  }
  else {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 3),0);
    if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 3),1);
      if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 3),2);
        if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) goto LAB_00177af0;
      }
    }
    (**(code **)(*in_RDI + 0x148))(0);
  }
  return;
}

Assistant:

void ezc3d::DataNS::Points3dNS::Point::set(double x, double y, double z) {
  ezc3d::Vector3d::set(x, y, z);
  if (!isValid() || (_data[0] == 0.0 && _data[1] == 0.0 && _data[2] == 0.0)) {
    residual(-1);
  } else {
    residual(0);
  }
}